

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

int __thiscall
TPZFMatrix<long_double>::Redim(TPZFMatrix<long_double> *this,int64_t newRows,int64_t newCols)

{
  longdouble *plVar1;
  ulong uVar2;
  
  uVar2 = newCols * newRows;
  if (uVar2 - (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
              (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow != 0) {
    plVar1 = this->fElem;
    if ((plVar1 != (longdouble *)0x0) && (plVar1 != this->fGiven)) {
      operator_delete__(plVar1);
    }
    plVar1 = this->fGiven;
    if ((plVar1 == (longdouble *)0x0) || (uVar2 - this->fSize != 0 && this->fSize <= (long)uVar2)) {
      if (uVar2 == 0) {
        plVar1 = (longdouble *)0x0;
      }
      else {
        plVar1 = (longdouble *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
      }
    }
    this->fElem = plVar1;
    if (plVar1 == (longdouble *)0x0 && uVar2 != 0) {
      Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = newRows;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = newCols;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return 1;
}

Assistant:

inline int TPZFMatrix<TVar>::Redim(const int64_t newRows,const int64_t newCols) {
    int64_t newsize = newRows*newCols;
    int64_t size = this->fRow*this->fCol;
    if ( newsize == size) {
        this->fRow = newRows;
        this->fCol = newCols;
        Zero();
        return( 1 );
    }
    if(this->fElem && this->fElem != this->fGiven) delete []this->fElem;
    
    if(this->fGiven && newsize <= this->fSize) {
        this->fElem = this->fGiven;
    } else if(newsize == 0) {
        this->fElem = NULL;
    } else {
        this->fElem = new TVar[ newsize ] ;
    }
#ifndef PZNODEBUG
    if (newsize && this->fElem == NULL )
        Error( "Resize <memory allocation error>." );
#endif
    
    this->fRow  = newRows;
    this->fCol  = newCols;
    
    Zero();
    
    return( 1 );
}